

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O1

int read_attribute_sub(coda_cdf_product *product_file,int64_t offset,int32_t byte_size,
                      coda_type *definition,coda_dynamic_type **attribute)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  undefined5 uVar5;
  uint8_t value;
  uint16_t value_00;
  int iVar6;
  double in_RAX;
  char *str;
  coda_mem_data *pcVar7;
  uchar *v;
  anon_union_8_9_56e8ce14 buffer;
  undefined8 local_38;
  
  if (definition->type_class == coda_text_class) {
    str = (char *)malloc((ulong)(byte_size + 1));
    if (str == (char *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                     (ulong)(uint)byte_size + 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                     ,0x4c);
      return -1;
    }
    iVar6 = read_bytes(product_file->raw_product,offset,(ulong)(uint)byte_size,str);
    if (iVar6 == 0) {
      str[(uint)byte_size] = '\0';
      pcVar7 = coda_mem_string_new((coda_type_text *)definition,(coda_dynamic_type *)0x0,
                                   (coda_product *)product_file,str);
      *attribute = (coda_dynamic_type *)pcVar7;
      free(str);
LAB_001246fa:
      return -(uint)(*attribute == (coda_dynamic_type *)0x0);
    }
    free(str);
  }
  else {
    local_38 = in_RAX;
    iVar6 = read_bytes(product_file->raw_product,offset,(ulong)(uint)byte_size,&local_38);
    if (iVar6 == 0) {
      if (product_file->endianness == coda_big_endian) {
        switch(byte_size) {
        case 1:
          break;
        case 2:
          local_38 = (double)CONCAT62(local_38._2_6_,
                                      (uint16_t)local_38 << 8 | (uint16_t)local_38 >> 8);
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                        ,0x81,
                        "int read_attribute_sub(coda_cdf_product *, int64_t, int32_t, coda_type *, coda_dynamic_type **)"
                       );
        case 4:
          uVar5 = CONCAT41(local_38._4_4_,(uint8_t)local_38);
          uVar1 = local_38._1_2_ << 8;
          uVar2 = local_38._1_2_ >> 8;
          local_38 = (double)CONCAT53(uVar5,CONCAT21(uVar1 | uVar2,local_38._3_1_));
          break;
        case 8:
          uVar1 = (uint16_t)local_38 << 8;
          uVar3 = (uint16_t)local_38 >> 8;
          uVar2 = local_38._2_2_ << 8;
          uVar4 = local_38._2_2_ >> 8;
          local_38._0_4_ =
               (float)CONCAT22(local_38._4_2_ << 8 | local_38._4_2_ >> 8,
                               local_38._6_2_ << 8 | local_38._6_2_ >> 8);
          local_38 = (double)CONCAT26(uVar1 | uVar3,CONCAT24(uVar2 | uVar4,(float)local_38));
        }
      }
      value = (uint8_t)local_38;
      value_00 = (uint16_t)local_38;
      switch(definition->read_type) {
      case coda_native_type_int8:
        pcVar7 = coda_mem_int8_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                   (coda_product *)product_file,value);
        break;
      case coda_native_type_uint8:
        pcVar7 = coda_mem_uint8_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                    (coda_product *)product_file,value);
        break;
      case coda_native_type_int16:
        pcVar7 = coda_mem_int16_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                    (coda_product *)product_file,value_00);
        break;
      case coda_native_type_uint16:
        pcVar7 = coda_mem_uint16_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                     (coda_product *)product_file,value_00);
        break;
      case coda_native_type_int32:
        pcVar7 = coda_mem_int32_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                    (coda_product *)product_file,(int32_t)(float)local_38);
        break;
      case coda_native_type_uint32:
        pcVar7 = coda_mem_uint32_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                     (coda_product *)product_file,(uint32_t)(float)local_38);
        break;
      case coda_native_type_int64:
        pcVar7 = coda_mem_int64_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                    (coda_product *)product_file,(int64_t)local_38);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                      ,0xaf,
                      "int read_attribute_sub(coda_cdf_product *, int64_t, int32_t, coda_type *, coda_dynamic_type **)"
                     );
      case coda_native_type_float:
        pcVar7 = coda_mem_float_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                    (coda_product *)product_file,(float)local_38);
        break;
      case coda_native_type_double:
        pcVar7 = coda_mem_double_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                     (coda_product *)product_file,local_38);
      }
      *attribute = (coda_dynamic_type *)pcVar7;
      goto LAB_001246fa;
    }
  }
  return -1;
}

Assistant:

static int read_attribute_sub(coda_cdf_product *product_file, int64_t offset, int32_t byte_size, coda_type *definition,
                              coda_dynamic_type **attribute)
{
    if (definition->type_class == coda_text_class)
    {
        char *buffer;

        buffer = malloc(byte_size + 1);
        if (buffer == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)byte_size + 1, __FILE__, __LINE__);
            return -1;
        }
        if (read_bytes(product_file->raw_product, offset, byte_size, buffer) != 0)
        {
            free(buffer);
            return -1;
        }
        buffer[byte_size] = '\0';
        *attribute = (coda_dynamic_type *)coda_mem_string_new((coda_type_text *)definition, NULL,
                                                              (coda_product *)product_file, buffer);
        free(buffer);
    }
    else
    {
#ifdef WORDS_BIGENDIAN
        coda_endianness other_endianness = coda_little_endian;
#else
        coda_endianness other_endianness = coda_big_endian;
#endif
        union
        {
            int8_t as_int8[8];
            uint8_t as_uint8[8];
            int16_t as_int16[4];
            uint16_t as_uint16[4];
            int32_t as_int32[2];
            uint32_t as_uint32[2];
            int64_t as_int64[1];
            float as_float[2];
            double as_double[1];
        } buffer;

        if (read_bytes(product_file->raw_product, offset, byte_size, buffer.as_int8) != 0)
        {
            return -1;
        }
        if (product_file->endianness == other_endianness)
        {
            switch (byte_size)
            {
                case 1:
                    break;
                case 2:
                    swap2(buffer.as_int16);
                    break;
                case 4:
                    swap4(buffer.as_int32);
                    break;
                case 8:
                    swap8(buffer.as_int64);
                    break;
                default:
                    assert(0);
                    exit(1);
            }
        }
        switch (definition->read_type)
        {
            case coda_native_type_int8:
                *attribute = (coda_dynamic_type *)coda_mem_int8_new((coda_type_number *)definition, NULL,
                                                                    (coda_product *)product_file, buffer.as_int8[0]);
                break;
            case coda_native_type_uint8:
                *attribute = (coda_dynamic_type *)coda_mem_uint8_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_uint8[0]);
                break;
            case coda_native_type_int16:
                *attribute = (coda_dynamic_type *)coda_mem_int16_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_int16[0]);
                break;
            case coda_native_type_uint16:
                *attribute = (coda_dynamic_type *)coda_mem_uint16_new((coda_type_number *)definition, NULL,
                                                                      (coda_product *)product_file,
                                                                      buffer.as_uint16[0]);
                break;
            case coda_native_type_int32:
                *attribute = (coda_dynamic_type *)coda_mem_int32_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_int32[0]);
                break;
            case coda_native_type_uint32:
                *attribute = (coda_dynamic_type *)coda_mem_uint32_new((coda_type_number *)definition, NULL,
                                                                      (coda_product *)product_file,
                                                                      buffer.as_uint32[0]);
                break;
            case coda_native_type_int64:
                *attribute = (coda_dynamic_type *)coda_mem_int64_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_int64[0]);
                break;
            case coda_native_type_float:
                *attribute = (coda_dynamic_type *)coda_mem_float_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_float[0]);
                break;
            case coda_native_type_double:
                *attribute = (coda_dynamic_type *)coda_mem_double_new((coda_type_number *)definition, NULL,
                                                                      (coda_product *)product_file,
                                                                      buffer.as_double[0]);
                break;
            default:
                assert(0);
                exit(1);
        }
    }
    if (*attribute == NULL)
    {
        return -1;
    }
    return 0;
}